

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetStringReference
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  string *default_value;
  FieldOptions *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar5;
  string *scratch_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetStringReference",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    default_value = FieldDescriptor::default_value_string_abi_cxx11_(field);
    this_local = (GeneratedMessageReflection *)ExtensionSet::GetString(this_00,number,default_value)
    ;
  }
  else {
    this_01 = FieldDescriptor::options(field);
    FieldOptions::ctype(this_01);
    ppbVar5 = GetField<std::__cxx11::string_const*>(this,message,field);
    this_local = (GeneratedMessageReflection *)*ppbVar5;
  }
  return (string *)this_local;
}

Assistant:

const string& GeneratedMessageReflection::GetStringReference(
    const Message& message,
    const FieldDescriptor* field, string* scratch) const {
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        return *GetField<const string*>(message, field);
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return kEmptyString;  // Make compiler happy.
  }
}